

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

int Ssw_RarSignalFilter(Aig_Man_t *pAig,Ssw_RarPars_t *pPars)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  abctime aVar4;
  abctime aVar5;
  Ssw_RarMan_t *p_00;
  Vec_Int_t *pVVar6;
  Ssw_Cla_t *pSVar7;
  Abc_Cex_t *pAVar8;
  char *pcVar9;
  byte local_91;
  Vec_Int_t *local_90;
  long local_60;
  int local_54;
  int local_50;
  int RetValue;
  int nSavedSeed;
  int nNumRestart;
  abctime nTimeToStop;
  abctime clkTotal;
  int k;
  int i;
  int f;
  int r;
  Ssw_RarMan_t *p;
  Ssw_RarPars_t *pPars_local;
  Aig_Man_t *pAig_local;
  
  k = -1;
  aVar4 = Abc_Clock();
  if (pPars->TimeOut == 0) {
    local_60 = 0;
  }
  else {
    iVar2 = pPars->TimeOut;
    aVar5 = Abc_Clock();
    local_60 = (long)iVar2 * 1000000 + aVar5;
  }
  RetValue = 0;
  local_50 = pPars->nRandSeed;
  local_54 = -1;
  iVar2 = Aig_ManRegNum(pAig);
  if (iVar2 < 1) {
    __assert_fail("Aig_ManRegNum(pAig) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x4cc,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  iVar2 = Aig_ManConstrNum(pAig);
  if (iVar2 != 0) {
    __assert_fail("Aig_ManConstrNum(pAig) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                  ,0x4cd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
  }
  iVar2 = Aig_ManNodeNum(pAig);
  if (iVar2 == 0) {
    pAig_local._4_4_ = -1;
  }
  else if ((pPars->fMiter == 0) || (iVar2 = Ssw_RarCheckTrivial(pAig,1), iVar2 == 0)) {
    if (pPars->fVerbose != 0) {
      Abc_Print(1,
                "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n"
                ,(ulong)(uint)pPars->nWords,(ulong)(uint)pPars->nFrames,(ulong)(uint)pPars->nRounds,
                (ulong)(uint)pPars->nRandSeed,pPars->TimeOut);
    }
    Ssw_RarManPrepareRandom(local_50);
    p_00 = Ssw_RarManStart(pAig,pPars);
    if (p_00->vInits != (Vec_Int_t *)0x0) {
      __assert_fail("p->vInits == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x4dd,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    if (pPars->pCex == (Abc_Cex_t *)0x0) {
      iVar2 = Aig_ManRegNum(pAig);
      pVVar6 = Vec_IntStart(iVar2);
      p_00->vInits = pVVar6;
    }
    else {
      pVVar6 = Ssw_RarFindStartingState(pAig,pPars->pCex);
      p_00->vInits = pVVar6;
      Abc_Print(1,"Beginning simulation from the state derived using the counter-example.\n");
    }
    for (clkTotal._4_4_ = 1; clkTotal._4_4_ < pPars->nWords; clkTotal._4_4_ = clkTotal._4_4_ + 1) {
      for (clkTotal._0_4_ = 0; iVar2 = Aig_ManRegNum(pAig), (int)clkTotal < iVar2;
          clkTotal._0_4_ = (int)clkTotal + 1) {
        pVVar6 = p_00->vInits;
        iVar2 = Vec_IntEntry(p_00->vInits,(int)clkTotal);
        Vec_IntPush(pVVar6,iVar2);
      }
    }
    iVar2 = Vec_IntSize(p_00->vInits);
    iVar3 = Aig_ManRegNum(pAig);
    if (iVar2 != iVar3 * pPars->nWords) {
      __assert_fail("Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/ssw/sswRarity.c"
                    ,0x4e9,"int Ssw_RarSignalFilter(Aig_Man_t *, Ssw_RarPars_t *)");
    }
    if (pAig->pReprs == (Aig_Obj_t **)0x0) {
      pSVar7 = Ssw_ClassesPrepareSimple(pAig,pPars->fLatchOnly,0);
      p_00->ppClasses = pSVar7;
    }
    else {
      pSVar7 = Ssw_ClassesPrepareFromReprs(pAig);
      p_00->ppClasses = pSVar7;
    }
    Ssw_ClassesSetData(p_00->ppClasses,p_00,Ssw_RarManObjHashWord,Ssw_RarManObjIsConst,
                       Ssw_RarManObjsAreEqual);
    if (pPars->fVerbose != 0) {
      Abc_Print(1,"Initial  :  ");
      Ssw_ClassesPrint(p_00->ppClasses,0);
    }
    i = 0;
    while( true ) {
      bVar1 = true;
      if (pPars->nRounds != 0) {
        bVar1 = RetValue * pPars->nRestart + i < pPars->nRounds;
      }
      if (!bVar1) goto LAB_007cac16;
      iVar2 = Ssw_ClassesCand1Num(p_00->ppClasses);
      if ((iVar2 == 0) && (iVar2 = Ssw_ClassesClassNum(p_00->ppClasses), iVar2 == 0)) break;
      for (k = 0; k < pPars->nFrames; k = k + 1) {
        if (k == 0) {
          local_90 = p_00->vInits;
        }
        else {
          local_90 = (Vec_Int_t *)0x0;
        }
        local_91 = 0;
        if (i == 0) {
          local_91 = k != 0 ^ 0xff;
        }
        Ssw_RarManSimulate(p_00,local_90,1,(uint)(local_91 & 1));
        if ((pPars->fMiter != 0) && (iVar2 = Ssw_RarManCheckNonConstOutputs(p_00,-1,0), iVar2 != 0))
        {
          if (pPars->fVerbose == 0) {
            iVar2 = Abc_FrameIsBatchMode();
            pcVar9 = "\r";
            if (iVar2 != 0) {
              pcVar9 = "\n";
            }
            Abc_Print(1,"%s",pcVar9);
          }
          if (pPars->fVerbose != 0) {
            Abc_Print(1,"Simulated %d frames for %d rounds with %d restarts.\n",
                      (ulong)(uint)pPars->nFrames,(ulong)(uint)(RetValue * pPars->nRestart + i),
                      (ulong)(uint)RetValue);
          }
          Ssw_RarManPrepareRandom(local_50);
          Abc_CexFree(pAig->pSeqModel);
          pAVar8 = Ssw_RarDeriveCex(p_00,i * p_00->pPars->nFrames + k,p_00->iFailPo,p_00->iFailPat,1
                                   );
          pAig->pSeqModel = pAVar8;
          Abc_Print(1,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                    (ulong)(uint)pAig->pSeqModel->iPo,pAig->pName,
                    (ulong)(uint)pAig->pSeqModel->iFrame);
          aVar5 = Abc_Clock();
          Abc_PrintTime(1,"Time",aVar5 - aVar4);
          local_54 = 0;
          goto LAB_007cac16;
        }
        if ((pPars->TimeOut != 0) && (aVar5 = Abc_Clock(), local_60 < aVar5)) {
          if (pPars->fVerbose != 0) {
            Abc_Print(1,"\n");
          }
          Abc_Print(1,"Simulated %d frames for %d rounds with %d restarts.  ",
                    (ulong)(uint)pPars->nFrames,(ulong)(uint)(RetValue * pPars->nRestart + i),
                    (ulong)(uint)RetValue);
          Abc_Print(1,"Reached timeout (%d sec).\n",(ulong)(uint)pPars->TimeOut);
          goto LAB_007cac16;
        }
      }
      if (((pPars->pCex == (Abc_Cex_t *)0x0) && (pPars->nRestart != 0)) && (i == pPars->nRestart)) {
        i = -1;
        local_50 = (local_50 + 1) % 1000;
        Ssw_RarManPrepareRandom(local_50);
        pVVar6 = p_00->vInits;
        iVar2 = Aig_ManRegNum(pAig);
        Vec_IntFill(pVVar6,iVar2 * pPars->nWords,0);
        RetValue = RetValue + 1;
        Vec_IntClear(p_00->vPatBests);
      }
      else {
        Ssw_RarTransferPatterns(p_00,p_00->vInits);
      }
      if (pPars->fVerbose == 0) {
        Abc_Print(1,".");
      }
      else {
        Abc_Print(1,"Round %3d:  ",(ulong)(uint)i);
        Ssw_ClassesPrint(p_00->ppClasses,0);
      }
      i = i + 1;
    }
    Abc_Print(1,"All equivalences are refined away.\n");
LAB_007cac16:
    if ((i == pPars->nRounds) && (k == pPars->nFrames)) {
      if (pPars->fVerbose == 0) {
        iVar2 = Abc_FrameIsBatchMode();
        pcVar9 = "\r";
        if (iVar2 != 0) {
          pcVar9 = "\n";
        }
        Abc_Print(1,"%s",pcVar9);
      }
      Abc_Print(1,"Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ",
                (ulong)(uint)pPars->nFrames,(ulong)(uint)(RetValue * pPars->nRestart + i),
                (ulong)(uint)RetValue);
      aVar5 = Abc_Clock();
      Abc_PrintTime(1,"Time",aVar5 - aVar4);
    }
    Ssw_RarManStop(p_00);
    pAig_local._4_4_ = local_54;
  }
  else {
    pAig_local._4_4_ = 0;
  }
  return pAig_local._4_4_;
}

Assistant:

int Ssw_RarSignalFilter( Aig_Man_t * pAig, Ssw_RarPars_t * pPars )
{
    Ssw_RarMan_t * p;
    int r, f = -1, i, k;
    abctime clkTotal = Abc_Clock();
    abctime nTimeToStop = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    int nNumRestart = 0;
    int nSavedSeed = pPars->nRandSeed;
    int RetValue = -1;
    assert( Aig_ManRegNum(pAig) > 0 );
    assert( Aig_ManConstrNum(pAig) == 0 );
    // consider the case of empty AIG
    if ( Aig_ManNodeNum(pAig) == 0 )
        return -1;
    // check trivially SAT miters
    if ( pPars->fMiter && Ssw_RarCheckTrivial( pAig, 1 ) )
        return 0;
    if ( pPars->fVerbose )
        Abc_Print( 1, "Rarity equiv filtering with %d words, %d frames, %d rounds, %d seed, and %d sec timeout.\n",
            pPars->nWords, pPars->nFrames, pPars->nRounds, pPars->nRandSeed, pPars->TimeOut );
    // reset random numbers
    Ssw_RarManPrepareRandom( nSavedSeed );

    // create manager
    p = Ssw_RarManStart( pAig, pPars );
    // compute starting state if needed
    assert( p->vInits == NULL );
    if ( pPars->pCex )
    {
        p->vInits = Ssw_RarFindStartingState( pAig, pPars->pCex );
        Abc_Print( 1, "Beginning simulation from the state derived using the counter-example.\n" );
    }
    else
        p->vInits = Vec_IntStart( Aig_ManRegNum(pAig) );
    // duplicate the array
    for ( i = 1; i < pPars->nWords; i++ )
        for ( k = 0; k < Aig_ManRegNum(pAig); k++ )
            Vec_IntPush( p->vInits, Vec_IntEntry(p->vInits, k) );
    assert( Vec_IntSize(p->vInits) == Aig_ManRegNum(pAig) * pPars->nWords );

    // create trivial equivalence classes with all nodes being candidates for constant 1
    if ( pAig->pReprs == NULL )
        p->ppClasses = Ssw_ClassesPrepareSimple( pAig, pPars->fLatchOnly, 0 );
    else
        p->ppClasses = Ssw_ClassesPrepareFromReprs( pAig );
    Ssw_ClassesSetData( p->ppClasses, p, Ssw_RarManObjHashWord, Ssw_RarManObjIsConst, Ssw_RarManObjsAreEqual );
    // print the stats
    if ( pPars->fVerbose )
    {
        Abc_Print( 1, "Initial  :  " );
        Ssw_ClassesPrint( p->ppClasses, 0 );
    }
    // refine classes using BMC
    for ( r = 0; !pPars->nRounds || (nNumRestart * pPars->nRestart + r < pPars->nRounds); r++ )
    {
        // start filtering equivalence classes
        if ( Ssw_ClassesCand1Num(p->ppClasses) == 0 && Ssw_ClassesClassNum(p->ppClasses) == 0 )
        {
            Abc_Print( 1, "All equivalences are refined away.\n" );
            break;
        }
        // simulate
        for ( f = 0; f < pPars->nFrames; f++ )
        {
            Ssw_RarManSimulate( p, f ? NULL : p->vInits, 1, !r && !f );
            if ( pPars->fMiter && Ssw_RarManCheckNonConstOutputs(p, -1, 0) )
            {
                if ( !pPars->fVerbose )
                    Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
//                Abc_Print( 1, "Simulation asserted a PO in frame f: %d <= f < %d.\n", r * pPars->nFrames, (r+1) * pPars->nFrames );
                if ( pPars->fVerbose )
                    Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.\n", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Ssw_RarManPrepareRandom( nSavedSeed );
                Abc_CexFree( pAig->pSeqModel );
                pAig->pSeqModel = Ssw_RarDeriveCex( p, r * p->pPars->nFrames + f, p->iFailPo, p->iFailPat, 1 );
                // print final report
                Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", pAig->pSeqModel->iPo, pAig->pName, pAig->pSeqModel->iFrame );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
                RetValue = 0;
                goto finish;
            }
            // check timeout
            if ( pPars->TimeOut && Abc_Clock() > nTimeToStop )
            {
                if ( pPars->fVerbose ) Abc_Print( 1, "\n" );
                Abc_Print( 1, "Simulated %d frames for %d rounds with %d restarts.  ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
                Abc_Print( 1, "Reached timeout (%d sec).\n",  pPars->TimeOut );
                goto finish;
            }
        }
        // get initialization patterns
        if ( pPars->pCex == NULL && pPars->nRestart && r == pPars->nRestart )
        {
            r = -1;
            nSavedSeed = (nSavedSeed + 1) % 1000;
            Ssw_RarManPrepareRandom( nSavedSeed );
            Vec_IntFill( p->vInits, Aig_ManRegNum(pAig) * pPars->nWords, 0 );
            nNumRestart++;
            Vec_IntClear( p->vPatBests );
            // clean rarity info
//            memset( p->pRarity, 0, sizeof(int) * (1 << nBinSize) * p->nGroups );
        }
        else
            Ssw_RarTransferPatterns( p, p->vInits );
        // printout
        if ( pPars->fVerbose )
        {
            Abc_Print( 1, "Round %3d:  ", r );
            Ssw_ClassesPrint( p->ppClasses, 0 );
        }
        else
        {
            Abc_Print( 1, "." );
        }
    }
finish:
    // report
    if ( r == pPars->nRounds && f == pPars->nFrames )
    {
        if ( !pPars->fVerbose )
            Abc_Print( 1, "%s", Abc_FrameIsBatchMode() ? "\n" : "\r" );
        Abc_Print( 1, "Simulation of %d frames for %d rounds with %d restarts did not assert POs.    ", pPars->nFrames, nNumRestart * pPars->nRestart + r, nNumRestart );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkTotal );
    }
    // cleanup
    Ssw_RarManStop( p );
    return RetValue;
}